

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx.c
# Opt level: O0

void sx__default_assert_handler(char *text,char *sourcefile,uint32_t line)

{
  char *endptr;
  char output_text [2048];
  uint32_t line_local;
  char *sourcefile_local;
  char *text_local;
  
  if (sourcefile == (char *)0x0) {
    sx_strcpy((char *)&endptr,0x800,"ASSERT FAILURE - ");
  }
  else {
    sx_snprintf((char *)&endptr,0x800,"%s(%d): ASSERT FAILURE - ",sourcefile,(ulong)line);
  }
  sx_strcat((char *)&endptr,0x800,text);
  fputs((char *)&endptr,_stderr);
  fflush(_stderr);
  return;
}

Assistant:

static void sx__default_assert_handler(const char* text, const char* sourcefile, uint32_t line)
{
    char output_text[2048];
    if (sourcefile) {
        sx_snprintf(output_text, sizeof(output_text), "%s(%d): ASSERT FAILURE - ", sourcefile, line);
    } else {
        sx_strcpy(output_text, sizeof(output_text), "ASSERT FAILURE - ");
    }
    char* endptr = sx_strcat(output_text, sizeof(output_text), text);
    sx_unused(endptr);

    // print
#if SX_PLATFORM_ANDROID
    __android_log_write(ANDROID_LOG_DEBUG, "", output_text);
#elif SX_PLATFORM_WINDOWS
    sx_strcat(endptr, sizeof(output_text), "\n");
    OutputDebugStringA(output_text);
#else
    fputs(output_text, stderr);
    fflush(stderr);
#endif
}